

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

ssize_t __thiscall cppcms::json::value::write(value *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  locale original;
  int in_stack_00000094;
  ostream *in_stack_00000098;
  value *in_stack_000000a0;
  ios_base *in_stack_ffffffffffffff98;
  locale local_50 [32];
  locale local_30 [8];
  locale local_28 [8];
  locale local_20 [12];
  undefined4 local_14;
  undefined8 local_10;
  value *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_14 = SUB84(__buf,0);
  local_8 = this;
  std::ios_base::getloc(in_stack_ffffffffffffff98);
  std::locale::locale(local_30,"C");
  std::ios::imbue(local_28);
  std::locale::~locale(local_28);
  std::locale::~locale(local_30);
  write_value(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  sVar1 = std::locale::~locale(local_20);
  return sVar1;
}

Assistant:

void value::write(std::ostream &out,int tabs) const
	{
		std::locale original(out.getloc());
		out.imbue(std::locale("C"));
		try {
			write_value(out,tabs);
		}
		catch(...) {
			out.imbue(original);
			throw;
		}
		out.imbue(original);

	}